

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O0

int __thiscall xray_re::_lzhuf::GetBit(_lzhuf *this)

{
  uint uVar1;
  FILE *in_RSI;
  int local_14;
  int i;
  _lzhuf *this_local;
  
  while (this->getlen < 9) {
    local_14 = getc(this,in_RSI);
    if (local_14 < 0) {
      local_14 = 0;
    }
    in_RSI = (FILE *)(ulong)this->getlen;
    this->getbuf = local_14 << (8 - this->getlen & 0x1f) | this->getbuf;
    this->getlen = this->getlen + '\b';
  }
  uVar1 = this->getbuf;
  this->getbuf = this->getbuf << 1;
  this->getlen = this->getlen + 0xff;
  return (int)uVar1 >> 0xf & 1;
}

Assistant:

int _lzhuf::GetBit(void)	/* get one bit */
{
	int i;

	while (getlen <= 8) {
		if ((i = getc()) < 0) i = 0;
		getbuf |= i << (8 - getlen);
		getlen += 8;
	}
	i = getbuf;
	getbuf <<= 1;
	getlen--;
	return (i >> 15) & 1;
}